

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O3

void vkt::tessellation::anon_unknown_2::initProgramsIsolinesCase
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  pointer pcVar1;
  char *pcVar2;
  size_t sVar3;
  ProgramSources *pPVar4;
  ostringstream src;
  long *local_228;
  long local_220;
  long local_218 [2];
  string local_208;
  uint local_1e8;
  value_type local_1e0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198 [14];
  ios_base local_128 [264];
  
  local_1c0._0_4_ = caseDef->primitiveType;
  local_1c0._4_4_ = caseDef->spacingMode;
  pcVar1 = (caseDef->referenceImagePathPrefix)._M_dataplus._M_p;
  local_1b8._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,
             pcVar1 + (caseDef->referenceImagePathPrefix)._M_string_length);
  initCommonPrograms(programCollection,(CaseDefinition *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"layout(",7);
  if ((ulong)caseDef->primitiveType < 3) {
    pcVar2 = *(char **)(&DAT_00d000f0 + (ulong)caseDef->primitiveType * 8);
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  else {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", ",2);
  if ((ulong)caseDef->spacingMode < 3) {
    pcVar2 = (&PTR_anon_var_dwarf_15bb72c_00d00108)[caseDef->spacingMode];
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  else {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n    float inner0;\n    float inner1;\n    float outer0;\n    float outer1;\n    float outer2;\n    float outer3;\n} sb_levels;\n"
             ,0xc4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) in  highp vec2 in_te_position[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) out highp vec4 in_f_color;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    highp vec2 corner0 = in_te_position[0];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    highp vec2 corner1 = in_te_position[1];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    highp vec2 corner2 = in_te_position[2];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    highp vec2 corner3 = in_te_position[3];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n",0x47);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n",0x47);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n",0x47);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n",0x48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    gl_Position = vec4(pos, 0.0, 1.0);\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "    highp int phaseX = int(round(gl_TessCoord.x*sb_levels.outer1));\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "    highp int phaseY = int(round(gl_TessCoord.y*sb_levels.outer0));\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    highp int phase = (phaseX + phaseY) % 3;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"               : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"               :              vec4(0.0, 0.0, 1.0, 1.0);\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"tese","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  local_1e8 = 4;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_228,local_220 + (long)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_1e8,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void initProgramsIsolinesCase (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.primitiveType == TESSPRIMITIVETYPE_ISOLINES);

	initCommonPrograms(programCollection, caseDef);

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ") in;\n"
			<< "\n"
			<< getTessLevelsSSBODeclaration()
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_te_position[];\n"
			<< "layout(location = 0) out highp vec4 in_f_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    highp vec2 corner0 = in_te_position[0];\n"
			<< "    highp vec2 corner1 = in_te_position[1];\n"
			<< "    highp vec2 corner2 = in_te_position[2];\n"
			<< "    highp vec2 corner3 = in_te_position[3];\n"
			<< "    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
			<< "                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
			<< "                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
			<< "                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
			<< "    pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n"
			<< "    gl_Position = vec4(pos, 0.0, 1.0);\n"
			<< "    highp int phaseX = int(round(gl_TessCoord.x*sb_levels.outer1));\n"
			<< "    highp int phaseY = int(round(gl_TessCoord.y*sb_levels.outer0));\n"
			<< "    highp int phase = (phaseX + phaseY) % 3;\n"
			<< "    in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
			<< "               : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
			<< "               :              vec4(0.0, 0.0, 1.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}